

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O2

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::removeHandle
          (cbtAxisSweep3Internal<unsigned_short> *this,unsigned_short handle,
          cbtDispatcher *dispatcher)

{
  unsigned_short *puVar1;
  ushort uVar2;
  ushort uVar3;
  Handle *pHVar4;
  Edge *pEVar5;
  int iVar6;
  long lVar7;
  undefined6 in_register_00000032;
  Handle *pHVar8;
  
  pHVar8 = this->m_pHandles + (CONCAT62(in_register_00000032,handle) & 0xffffffff);
  iVar6 = (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback
            [0xf])();
  if ((char)iVar6 == '\0') {
    (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[4])
              (this->m_pairCache,pHVar8,dispatcher);
  }
  uVar2 = this->m_numHandles;
  pHVar4 = this->m_pHandles;
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    puVar1 = pHVar4->m_maxEdges + lVar7;
    *puVar1 = *puVar1 - 2;
  }
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    pEVar5 = this->m_pEdges[lVar7];
    uVar3 = pHVar8->m_maxEdges[lVar7];
    pEVar5[uVar3].m_pos = this->m_handleSentinel;
    sortMaxUp(this,(int)lVar7,uVar3,dispatcher,false);
    uVar3 = pHVar8->m_maxEdges[lVar7 + -3];
    pEVar5[uVar3].m_pos = this->m_handleSentinel;
    sortMinUp(this,(int)lVar7,uVar3,dispatcher,false);
    pEVar5[(ulong)uVar2 * 2 + -1].m_handle = 0;
    pEVar5[(ulong)uVar2 * 2 + -1].m_pos = this->m_handleSentinel;
  }
  freeHandle(this,handle);
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::removeHandle(BP_FP_INT_TYPE handle, cbtDispatcher* dispatcher)
{
	Handle* pHandle = getHandle(handle);

	//explicitly remove the pairs containing the proxy
	//we could do it also in the sortMinUp (passing true)
	///@todo: compare performance
	if (!m_pairCache->hasDeferredRemoval())
	{
		m_pairCache->removeOverlappingPairsContainingProxy(pHandle, dispatcher);
	}

	// compute current limit of edge arrays
	int limit = static_cast<int>(m_numHandles * 2);

	int axis;

	for (axis = 0; axis < 3; axis++)
	{
		m_pHandles[0].m_maxEdges[axis] -= 2;
	}

	// remove the edges by sorting them up to the end of the list
	for (axis = 0; axis < 3; axis++)
	{
		Edge* pEdges = m_pEdges[axis];
		BP_FP_INT_TYPE max = pHandle->m_maxEdges[axis];
		pEdges[max].m_pos = m_handleSentinel;

		sortMaxUp(axis, max, dispatcher, false);

		BP_FP_INT_TYPE i = pHandle->m_minEdges[axis];
		pEdges[i].m_pos = m_handleSentinel;

		sortMinUp(axis, i, dispatcher, false);

		pEdges[limit - 1].m_handle = 0;
		pEdges[limit - 1].m_pos = m_handleSentinel;

#ifdef DEBUG_BROADPHASE
		debugPrintAxis(axis, false);
#endif  //DEBUG_BROADPHASE
	}

	// free the handle
	freeHandle(handle);
}